

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

size_t __thiscall
Fossilize::ConcurrentDatabase::get_total_num_hashes_for_tag
          (ConcurrentDatabase *this,ResourceTag tag)

{
  DatabaseInterface *pDVar1;
  pointer puVar2;
  int iVar3;
  size_t sVar4;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_> *e;
  pointer puVar5;
  size_t hash_count;
  size_t local_38;
  
  local_38 = 0;
  pDVar1 = (this->readonly_interface)._M_t.
           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  if (pDVar1 == (DatabaseInterface *)0x0) {
    local_38 = 0;
  }
  else {
    iVar3 = (*pDVar1->_vptr_DatabaseInterface[6])(pDVar1,tag,&local_38,0);
    if ((char)iVar3 == '\0') {
      return 0;
    }
  }
  puVar5 = (this->extra_readonly).
           super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->extra_readonly).
           super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar4 = local_38;
  do {
    if (puVar5 == puVar2) {
      return sVar4;
    }
    local_38 = 0;
    pDVar1 = (puVar5->_M_t).
             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if (pDVar1 == (DatabaseInterface *)0x0) {
      local_38 = 0;
    }
    else {
      iVar3 = (*pDVar1->_vptr_DatabaseInterface[6])(pDVar1,tag,&local_38,0);
      if ((char)iVar3 == '\0') {
        return 0;
      }
    }
    sVar4 = sVar4 + local_38;
    puVar5 = puVar5 + 1;
  } while( true );
}

Assistant:

size_t get_total_num_hashes_for_tag(ResourceTag tag) const
	{
		size_t count = 0;

		// This is an upper bound, we might prune it later, although in general we don't expect duplicates.
		size_t hash_count = 0;
		if (readonly_interface &&
		    !readonly_interface->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
			return 0;
		count += hash_count;

		for (auto &e : extra_readonly)
		{
			hash_count = 0;
			if (e && !e->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
				return 0;
			count += hash_count;
		}

		return count;
	}